

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall
CTcSymObjBase::add_vocab_word(CTcSymObjBase *this,char *txt,size_t len,tctarg_prop_id_t prop)

{
  CTcVocabEntry *this_00;
  tctarg_prop_id_t in_CX;
  size_t in_RDX;
  char *in_RSI;
  size_t in_RDI;
  CTcVocabEntry *entry;
  CTcPrsMem *in_stack_ffffffffffffffc8;
  
  this_00 = (CTcVocabEntry *)operator_new(in_RDI,in_stack_ffffffffffffffc8);
  CTcVocabEntry::CTcVocabEntry(this_00,in_RSI,in_RDX,in_CX);
  this_00->nxt_ = *(CTcVocabEntry **)(in_RDI + 0x68);
  *(CTcVocabEntry **)(in_RDI + 0x68) = this_00;
  return;
}

Assistant:

void CTcSymObjBase::add_vocab_word(const char *txt, size_t len,
                                   tctarg_prop_id_t prop)
{
    /* create a new vocabulary entry */
    CTcVocabEntry *entry = new (G_prsmem) CTcVocabEntry(txt, len, prop);

    /* link it into my list */
    entry->nxt_ = vocab_;
    vocab_ = entry;
}